

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5Bm25GetData(Fts5ExtensionApi *pApi,Fts5Context *pFts,Fts5Bm25Data **ppData)

{
  double local_68;
  double idf;
  sqlite3_int64 nHit;
  sqlite3_uint64 sStack_50;
  int i;
  sqlite3_int64 nByte;
  sqlite3_int64 nToken;
  sqlite3_int64 nRow;
  Fts5Bm25Data *pFStack_30;
  int nPhrase;
  Fts5Bm25Data *p;
  Fts5Bm25Data **ppFStack_20;
  int rc;
  Fts5Bm25Data **ppData_local;
  Fts5Context *pFts_local;
  Fts5ExtensionApi *pApi_local;
  
  p._4_4_ = 0;
  ppFStack_20 = ppData;
  ppData_local = (Fts5Bm25Data **)pFts;
  pFts_local = (Fts5Context *)pApi;
  pFStack_30 = (Fts5Bm25Data *)(*pApi->xGetAuxdata)(pFts,0);
  if (pFStack_30 == (Fts5Bm25Data *)0x0) {
    nToken = 0;
    nByte = 0;
    nRow._4_4_ = (**(code **)(pFts_local + 0x30))(ppData_local);
    sStack_50 = (long)(nRow._4_4_ << 1) * 8 + 0x20;
    pFStack_30 = (Fts5Bm25Data *)sqlite3_malloc64(sStack_50);
    if (pFStack_30 == (Fts5Bm25Data *)0x0) {
      p._4_4_ = 7;
    }
    else {
      memset(pFStack_30,0,sStack_50);
      pFStack_30->nPhrase = nRow._4_4_;
      pFStack_30->aIDF = (double *)(pFStack_30 + 1);
      pFStack_30->aFreq = pFStack_30->aIDF + nRow._4_4_;
    }
    if (p._4_4_ == 0) {
      p._4_4_ = (**(code **)(pFts_local + 0x18))(ppData_local,&nToken);
    }
    if (p._4_4_ == 0) {
      p._4_4_ = (**(code **)(pFts_local + 0x20))(ppData_local,0xffffffff,&nByte);
    }
    if (p._4_4_ == 0) {
      pFStack_30->avgdl = (double)nByte / (double)nToken;
    }
    for (nHit._4_4_ = 0; p._4_4_ == 0 && nHit._4_4_ < nRow._4_4_; nHit._4_4_ = nHit._4_4_ + 1) {
      idf = 0.0;
      p._4_4_ = (**(code **)(pFts_local + 0x68))(ppData_local,nHit._4_4_,&idf,fts5CountCb);
      if (p._4_4_ == 0) {
        local_68 = log(((double)(nToken - (long)idf) + 0.5) / ((double)(long)idf + 0.5));
        if (local_68 <= 0.0) {
          local_68 = 1e-06;
        }
        pFStack_30->aIDF[nHit._4_4_] = local_68;
      }
    }
    if (p._4_4_ == 0) {
      p._4_4_ = (**(code **)(pFts_local + 0x70))(ppData_local,pFStack_30,sqlite3_free);
    }
    else {
      sqlite3_free(pFStack_30);
    }
    if (p._4_4_ != 0) {
      pFStack_30 = (Fts5Bm25Data *)0x0;
    }
  }
  *ppFStack_20 = pFStack_30;
  return p._4_4_;
}

Assistant:

static int fts5Bm25GetData(
  const Fts5ExtensionApi *pApi, 
  Fts5Context *pFts,
  Fts5Bm25Data **ppData           /* OUT: bm25-data object for this query */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Bm25Data *p;                /* Object to return */

  p = pApi->xGetAuxdata(pFts, 0);
  if( p==0 ){
    int nPhrase;                  /* Number of phrases in query */
    sqlite3_int64 nRow = 0;       /* Number of rows in table */
    sqlite3_int64 nToken = 0;     /* Number of tokens in table */
    sqlite3_int64 nByte;          /* Bytes of space to allocate */
    int i;

    /* Allocate the Fts5Bm25Data object */
    nPhrase = pApi->xPhraseCount(pFts);
    nByte = sizeof(Fts5Bm25Data) + nPhrase*2*sizeof(double);
    p = (Fts5Bm25Data*)sqlite3_malloc64(nByte);
    if( p==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(p, 0, (size_t)nByte);
      p->nPhrase = nPhrase;
      p->aIDF = (double*)&p[1];
      p->aFreq = &p->aIDF[nPhrase];
    }

    /* Calculate the average document length for this FTS5 table */
    if( rc==SQLITE_OK ) rc = pApi->xRowCount(pFts, &nRow);
    assert( rc!=SQLITE_OK || nRow>0 );
    if( rc==SQLITE_OK ) rc = pApi->xColumnTotalSize(pFts, -1, &nToken);
    if( rc==SQLITE_OK ) p->avgdl = (double)nToken  / (double)nRow;

    /* Calculate an IDF for each phrase in the query */
    for(i=0; rc==SQLITE_OK && i<nPhrase; i++){
      sqlite3_int64 nHit = 0;
      rc = pApi->xQueryPhrase(pFts, i, (void*)&nHit, fts5CountCb);
      if( rc==SQLITE_OK ){
        /* Calculate the IDF (Inverse Document Frequency) for phrase i.
        ** This is done using the standard BM25 formula as found on wikipedia:
        **
        **   IDF = log( (N - nHit + 0.5) / (nHit + 0.5) )
        **
        ** where "N" is the total number of documents in the set and nHit
        ** is the number that contain at least one instance of the phrase
        ** under consideration.
        **
        ** The problem with this is that if (N < 2*nHit), the IDF is 
        ** negative. Which is undesirable. So the mimimum allowable IDF is
        ** (1e-6) - roughly the same as a term that appears in just over
        ** half of set of 5,000,000 documents.  */
        double idf = log( (nRow - nHit + 0.5) / (nHit + 0.5) );
        if( idf<=0.0 ) idf = 1e-6;
        p->aIDF[i] = idf;
      }
    }

    if( rc!=SQLITE_OK ){
      sqlite3_free(p);
    }else{
      rc = pApi->xSetAuxdata(pFts, p, sqlite3_free);
    }
    if( rc!=SQLITE_OK ) p = 0;
  }
  *ppData = p;
  return rc;
}